

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O2

bool __thiscall cmDebugger_impl::ClearWatchpoint(cmDebugger_impl *this,watchpoint_id id)

{
  size_t sVar1;
  iterator iVar2;
  size_t sVar3;
  shared_ptr<cmDebugger_impl::Watchpoint> watchpoint;
  watchpoint_id local_48;
  __shared_ptr<cmDebugger_impl::Watchpoint,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  local_48 = id;
  std::mutex::lock(&this->breakpointMutex);
  iVar2 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>_>_>_>
          ::find(&(this->activeWatchpoints)._M_t,&local_48);
  sVar1 = (this->activeWatchpoints)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  sVar3 = sVar1;
  if ((_Rb_tree_header *)iVar2._M_node !=
      &(this->activeWatchpoints)._M_t._M_impl.super__Rb_tree_header) {
    std::__shared_ptr<cmDebugger_impl::Watchpoint,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,&iVar2._M_node[1]._M_parent);
    if (local_40._M_ptr != (element_type *)0x0) {
      cmVariableWatch::RemoveWatch
                (this->CMakeInstance->VariableWatch,
                 &((local_40._M_ptr)->super_cmWatchpoint).Variable,WatchMethodCB,
                 (local_40._M_ptr)->user_data);
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>_>_>_>
      ::erase(&(this->activeWatchpoints)._M_t,&local_48);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    sVar3 = (this->activeWatchpoints)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->breakpointMutex);
  return sVar1 != sVar3;
}

Assistant:

bool ClearWatchpoint(watchpoint_id id) override
  {
    std::lock_guard<std::mutex> l(breakpointMutex);
    auto watchpointIt = activeWatchpoints.find(id);
    auto originalSize = activeWatchpoints.size();
    if (watchpointIt != activeWatchpoints.end()) {
      if (auto watchpoint = watchpointIt->second.lock()) {
        this->CMakeInstance.GetVariableWatch()->RemoveWatch(
          watchpoint->Variable, WatchMethodCB, watchpoint->user_data);
        activeWatchpoints.erase(id);
      }
    }

    return originalSize != activeWatchpoints.size();
  }